

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O1

int __thiscall soplex::SPxSteepPR<double>::selectLeaveX(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::soplex::infinity::__tls_init();
  lVar8 = (long)(((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
  if (lVar8 < 1) {
    iVar7 = -1;
  }
  else {
    dVar9 = -*(double *)(in_FS_OFFSET + -8);
    iVar7 = -1;
    do {
      dVar1 = pdVar4[lVar8 + -1];
      if (dVar1 < -tol) {
        dVar2 = pdVar5[lVar8 + -1];
        dVar10 = tol;
        if (tol <= dVar2) {
          dVar10 = dVar2;
        }
        dVar10 = (dVar1 * dVar1) / dVar10;
        if (dVar9 < dVar10) {
          iVar7 = (int)lVar8 + -1;
          dVar9 = dVar10;
        }
      }
      bVar6 = 1 < lVar8;
      lVar8 = lVar8 + -1;
    } while (bVar6);
  }
  return iVar7;
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}